

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int runQMake(int argc,char **argv)

{
  long lVar1;
  Data *pDVar2;
  FILE *pFVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  qsizetype qVar8;
  iterator in;
  iterator iVar9;
  ssize_t sVar10;
  MetaMakefileGenerator *pMVar11;
  size_t __nbytes;
  size_t sVar12;
  char16_t *pcVar13;
  char **argv_00;
  ulong n;
  char *__s1;
  iterator copy;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_618;
  bool success;
  QDir dir;
  char16_t *pcStack_5e0;
  size_t local_5d8;
  QFileInfo fi;
  QMakeParser parser;
  ProFileCache proFileCache;
  QMakeProperty local_528;
  QArrayDataPointer<QString> local_518;
  QArrayDataPointer<char16_t> local_4f8;
  QMakeVfs vfs;
  QMakeProject project;
  QMakeGlobals globals;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashSeed::setDeterministicGlobalSeed();
  setvbuf(_stdout,(char *)0x0,2,0);
  if (argc < 4) {
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_0020a10b;
    }
  }
  else {
    __s1 = argv[1];
    iVar6 = strcmp(__s1,"-qtconf");
    if ((iVar6 == 0) && (iVar6 = strcmp(argv[3],"-install"), iVar6 == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        iVar6 = argc + -4;
        argv_00 = argv + 4;
        goto LAB_0020a1a1;
      }
      goto LAB_0020ab70;
    }
LAB_0020a10b:
    iVar6 = strcmp(__s1,"-install");
    if (iVar6 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        iVar6 = argc + -2;
        argv_00 = argv + 2;
LAB_0020a1a1:
        iVar6 = doInstall(iVar6,argv_00);
        return iVar6;
      }
      goto LAB_0020ab70;
    }
  }
  vfs = (QMakeVfs)0xaa;
  QMakeVfs::QMakeVfs(&vfs);
  Option::vfs = &vfs;
  memset(&globals,0xaa,0x1b8);
  QMakeGlobals::QMakeGlobals(&globals);
  Option::globals = &globals;
  uVar7 = Option::init((Option *)(ulong)(uint)argc,(EVP_PKEY_CTX *)argv);
  if (uVar7 == 0) {
    local_4f8.size = -0x5555555555555556;
    local_4f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_4f8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    qmake_getpwd();
    QString::operator=(&Option::output_dir,(QString *)&local_4f8);
    QFile::fileName();
    if (project.super_QMakeEvaluator.m_current.pro == (ProFile *)0x0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&project);
    }
    else {
      QFile::fileName();
      local_518.d = (Data *)0x21c57f;
      bVar4 = operator!=((QString *)&parser,(char **)&local_518);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&project);
      if (bVar4) {
        _fi = (Data *)0xaaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo(&fi,(QFileDevice *)Option::output);
        _dir = (Data *)0xaaaaaaaaaaaaaaaa;
        cVar5 = QFileInfo::isDir();
        if (cVar5 == '\0') {
          QFileInfo::absolutePath();
        }
        else {
          QFileInfo::absoluteFilePath();
        }
        QDir::cleanPath((QString *)&project);
        QDir::QDir(&dir,(QString *)&project);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&project);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
        QDir::dirName();
        qVar8 = QtPrivate::lengthHelperPointer<char>(".xcodeproj");
        cVar5 = QString::endsWith((QLatin1String *)&project,(CaseSensitivity)qVar8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&project);
        if (cVar5 != '\0') {
          QString::QString((QString *)&local_518,"..");
          QDir::filePath((QString *)&parser);
          QDir::cleanPath((QString *)&project);
          QDir::setPath((QString *)&dir);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&project);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_518)
          ;
        }
        QDir::path();
        qVar8 = Option::output_dir.d.size;
        pcVar13 = Option::output_dir.d.ptr;
        pDVar2 = Option::output_dir.d.d;
        Option::output_dir.d.d = (Data *)project.super_QMakeEvaluator.m_caller;
        Option::output_dir.d.ptr = (char16_t *)project.super_QMakeEvaluator._8_8_;
        project.super_QMakeEvaluator.m_caller = (QMakeEvaluator *)pDVar2;
        project.super_QMakeEvaluator._8_8_ = pcVar13;
        Option::output_dir.d.size = (qsizetype)project.super_QMakeEvaluator.m_current.pro;
        project.super_QMakeEvaluator.m_current.pro = (ProFile *)qVar8;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&project);
        project.super_QMakeEvaluator.m_current.pro = (ProFile *)0xaaaaaaaaaaaaaaaa;
        project.super_QMakeEvaluator.m_caller = (QMakeEvaluator *)0xaaaaaaaaaaaaaaaa;
        project.super_QMakeEvaluator.m_debugLevel = -0x55555556;
        project.super_QMakeEvaluator._12_4_ = 0xaaaaaaaa;
        QFileInfo::absoluteFilePath();
        QDir::cleanPath((QString *)&project);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
        QString::mid((longlong)&parser,(longlong)&project);
        QFile::setFileName((QString *)Option::output);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&project);
        QDir::~QDir(&dir);
        QFileInfo::~QFileInfo(&fi);
      }
    }
    local_528.settings = (QSettings *)0xaaaaaaaaaaaaaaaa;
    local_528.m_values.d = (Data *)0xaaaaaaaaaaaaaaaa;
    QMakeProperty::QMakeProperty(&local_528);
    if (Option::qmake_mode == QMAKE_SET_PROPERTY) {
      uVar7 = QMakeProperty::setProperty(&local_528,&Option::prop::properties);
    }
    else if (Option::qmake_mode == QMAKE_UNSET_PROPERTY) {
      QMakeProperty::unsetProperty(&local_528,&Option::prop::properties);
      uVar7 = 0;
    }
    else if (Option::qmake_mode == QMAKE_QUERY_PROPERTY) {
      project.super_QMakeEvaluator.m_debugLevel = 0;
      project.super_QMakeEvaluator._12_4_ = 0;
      project.super_QMakeEvaluator.m_caller = (QMakeEvaluator *)qmakePropertyPrinter;
      project.super_QMakeEvaluator.m_current._8_8_ =
           std::
           _Function_handler<void_(const_QList<std::pair<QString,_QString>_>_&),_void_(*)(const_QList<std::pair<QString,_QString>_>_&)>
           ::_M_invoke;
      project.super_QMakeEvaluator.m_current.pro =
           (ProFile *)
           std::
           _Function_handler<void_(const_QList<std::pair<QString,_QString>_>_&),_void_(*)(const_QList<std::pair<QString,_QString>_>_&)>
           ::_M_manager;
      uVar7 = QMakeProperty::queryProperty
                        (&local_528,&Option::prop::properties,(PropertyPrinter *)&project);
      if (project.super_QMakeEvaluator.m_current.pro != (ProFile *)0x0) {
        (*(code *)project.super_QMakeEvaluator.m_current.pro)(&project,&project,3);
      }
    }
    else {
      proFileCache.parsed_files.d = (QHash<int,_ProFileCache::Entry>)(Data *)0xaaaaaaaaaaaaaaaa;
      globals.property = &local_528;
      ProFileCache::ProFileCache(&proFileCache);
      parser.m_handler = (QMakeParserHandler *)0xaaaaaaaaaaaaaaaa;
      parser.m_vfs = (QMakeVfs *)0xaaaaaaaaaaaaaaaa;
      parser.m_tmp.d.size = -0x5555555555555556;
      parser.m_cache = (ProFileCache *)0xaaaaaaaaaaaaaaaa;
      parser.m_tmp.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      parser.m_tmp.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      parser.m_inError = true;
      parser.m_canElse = true;
      parser._50_2_ = 0xaaaa;
      parser.m_invert = -0x55555556;
      parser.m_operator = 0xaaaaaaaa;
      parser._60_4_ = 0xaaaaaaaa;
      parser.m_blockstack.super_QList<QMakeParser::BlockScope>.d.size = -0x5555555555555556;
      parser.m_state = 0xaaaaaaaa;
      parser.m_markLine = -0x55555556;
      parser.m_blockstack.super_QList<QMakeParser::BlockScope>.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      parser.m_blockstack.super_QList<QMakeParser::BlockScope>.d.ptr =
           (BlockScope *)0xaaaaaaaaaaaaaaaa;
      parser.m_proFile = (ProFile *)0xaaaaaaaaaaaaaaaa;
      parser.m_lineNo = -0x55555556;
      parser._12_4_ = 0xaaaaaaaa;
      Option::proFileCache = &proFileCache;
      QMakeParser::QMakeParser
                (&parser,&proFileCache,&vfs,(QMakeParserHandler *)&Option::evalHandler);
      Option::parser = &parser;
      memset(&project,0xaa,0x2e0);
      QMakeProject::QMakeProject(&project);
      local_518.size = 0;
      local_518.d = (Data *)0x0;
      local_518.ptr = (QString *)0x0;
      if (Option::qmake_mode == QMAKE_GENERATE_PROJECT) {
        QString::QString((QString *)&fi,"(*hack*)");
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_518,(QString *)&fi);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
      }
      else {
        QArrayDataPointer<QString>::operator=(&local_518,&Option::mkfile::project_files.d);
      }
      in = QList<QString>::begin((QList<QString> *)&local_518);
      uVar7 = 0;
      while( true ) {
        sVar12 = local_5d8;
        iVar9 = QList<QString>::end((QList<QString> *)&local_518);
        if (in.i == iVar9.i) break;
        if ((Option::qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
          _fi = (Data *)0xaaaaaaaaaaaaaaaa;
          __nbytes = 1;
          Option::normalizePath((QString *)&fi,in.i,true,true);
          cVar5 = QFile::exists((QString *)&fi);
          pFVar3 = _stderr;
          if (cVar5 == '\0') {
            QDir::toNativeSeparators((QString *)&success);
            QString::toLatin1_helper_inplace((QString *)&dir);
            pcVar13 = pcStack_5e0;
            if (pcStack_5e0 == (char16_t *)0x0) {
              pcVar13 = (char16_t *)&QByteArray::_empty;
            }
            fprintf(pFVar3,"Cannot find file: %s.\n",pcVar13);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dir);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&success)
            ;
            uVar7 = 2;
LAB_0020a955:
            bVar4 = false;
          }
          else {
            if (Option::debug_level != 0) {
              QDir::toNativeSeparators((QString *)&success);
              QString::toLatin1_helper_inplace((QString *)&dir);
              pcVar13 = pcStack_5e0;
              if (pcStack_5e0 == (char16_t *)0x0) {
                pcVar13 = (char16_t *)&QByteArray::_empty;
              }
              debug_msg_internal(1,"Resetting dir to: %s",pcVar13);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dir);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&success);
            }
            qmake_setpwd((QString *)&local_4f8);
            qVar8 = QString::lastIndexOf((QString *)&fi,(QChar)0x2f,CaseSensitive);
            iVar6 = (int)qVar8;
            if (iVar6 != -1) {
              if (Option::debug_level != 0) {
                QString::left((QString *)&local_618,(QString *)&fi,(long)iVar6);
                QDir::toNativeSeparators((QString *)&success);
                QString::toLatin1_helper_inplace((QString *)&dir);
                pcVar13 = pcStack_5e0;
                if (pcStack_5e0 == (char16_t *)0x0) {
                  pcVar13 = (char16_t *)&QByteArray::_empty;
                }
                debug_msg_internal(1,"Changing dir to: %s",pcVar13);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dir);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&success);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_618);
              }
              n = (ulong)iVar6;
              QString::left((QString *)&dir,(QString *)&fi,n);
              bVar4 = qmake_setpwd((QString *)&dir);
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
              pFVar3 = _stderr;
              if (!bVar4) {
                QString::left((QString *)&local_618,(QString *)&fi,n);
                QDir::toNativeSeparators((QString *)&success);
                QString::toLatin1_helper_inplace((QString *)&dir);
                if (pcStack_5e0 == (char16_t *)0x0) {
                  pcStack_5e0 = (char16_t *)&QByteArray::_empty;
                }
                fprintf(pFVar3,"Cannot find directory: %s\n",pcStack_5e0);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dir);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&success);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_618);
              }
              QString::right((QString *)&dir,(QString *)&fi,~n + 0xaaaaaaaaaaaaaaaa);
              pDVar2 = _fi;
              _fi = _dir;
              _dir = pDVar2;
              pcStack_5e0 = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_5d8 = 0xaaaaaaaaaaaaaaaa;
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir);
              __nbytes = sVar12;
            }
            Option::prepareProject((QString *)&fi);
            sVar10 = QMakeProject::read(&project,(int)(QArrayDataPointer<char16_t> *)&fi,(void *)0x3
                                        ,__nbytes);
            pFVar3 = _stderr;
            if ((char)sVar10 == '\0') {
              QDir::toNativeSeparators((QString *)&success);
              QString::toLatin1_helper_inplace((QString *)&dir);
              pcVar13 = pcStack_5e0;
              if (pcStack_5e0 == (char16_t *)0x0) {
                pcVar13 = (char16_t *)&QByteArray::_empty;
              }
              fprintf(pFVar3,"Error processing project file: %s\n",pcVar13);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dir);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&success);
              uVar7 = 3;
              goto LAB_0020a955;
            }
            bVar4 = true;
            if (Option::mkfile::do_preprocess == true) {
              QMakeProject::dump(&project);
              bVar4 = false;
            }
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
          if (bVar4) goto LAB_0020a963;
        }
        else {
LAB_0020a963:
          success = true;
          _fi = (Data *)0x0;
          pMVar11 = MetaMakefileGenerator::createMetaGenerator
                              (&project,(QString *)&fi,false,&success);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
          if (success == false) {
            uVar7 = 3;
          }
          if (pMVar11 != (MetaMakefileGenerator *)0x0) {
            iVar6 = (*pMVar11->_vptr_MetaMakefileGenerator[4])(pMVar11);
            pFVar3 = _stderr;
            if ((char)iVar6 == '\0') {
              if (Option::qmake_mode == QMAKE_GENERATE_PROJECT) {
                fwrite("Unable to generate project file.\n",0x21,1,_stderr);
                uVar7 = 5;
              }
              else {
                QDir::toNativeSeparators((QString *)&dir);
                QString::toLatin1_helper_inplace((QString *)&fi);
                fprintf(pFVar3,"Unable to generate makefile for: %s\n",&QByteArray::_empty);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&fi);
                QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dir)
                ;
                uVar7 = 5;
              }
            }
            (*pMVar11->_vptr_MetaMakefileGenerator[1])(pMVar11);
          }
        }
        in.i = in.i + 1;
      }
      qmakeClearCaches();
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_518);
      QMakeProject::~QMakeProject(&project);
      QMakeParser::~QMakeParser(&parser);
      ProFileCache::~ProFileCache(&proFileCache);
    }
    QMakeProperty::~QMakeProperty(&local_528);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4f8);
  }
  else {
    uVar7 = uVar7 >> 2 & 1;
  }
  QMakeGlobals::~QMakeGlobals(&globals);
  QMakeVfs::~QMakeVfs(&vfs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar7;
  }
LAB_0020ab70:
  __stack_chk_fail();
}

Assistant:

int runQMake(int argc, char **argv)
{
    QHashSeed::setDeterministicGlobalSeed();

    // stderr is unbuffered by default, but stdout buffering depends on whether
    // there is a terminal attached. Buffering can make output from stderr and stdout
    // appear out of sync, so force stdout to be unbuffered as well.
    // This is particularly important for things like QtCreator and scripted builds.
    setvbuf(stdout, (char *)NULL, _IONBF, 0);

    // Workaround for inferior/missing command line tools on Windows: make our own!
    if (argc >= 4 && !strcmp(argv[1], "-qtconf") && !strcmp(argv[3], "-install"))
        return doInstall(argc - 4, argv + 4);
    if (argc >= 2 && !strcmp(argv[1], "-install"))
        return doInstall(argc - 2, argv + 2);

#ifdef Q_OS_WIN
    {
        // Support running as Visual C++'s compiler
        const wchar_t *cmdline = _wgetenv(L"MSC_CMD_FLAGS");
        if (!cmdline || !*cmdline)
            cmdline = _wgetenv(L"MSC_IDE_FLAGS");
        if (cmdline && *cmdline)
            return dumpMacros(cmdline);
    }
#endif

    QMakeVfs vfs;
    Option::vfs = &vfs;
    QMakeGlobals globals;
    Option::globals = &globals;

    // parse command line
    int ret = Option::init(argc, argv);
    if(ret != Option::QMAKE_CMDLINE_SUCCESS) {
        if ((ret & Option::QMAKE_CMDLINE_ERROR) != 0)
            return 1;
        return 0;
    }

    QString oldpwd = qmake_getpwd();

    Option::output_dir = oldpwd; //for now this is the output dir
    if (!Option::output.fileName().isEmpty() && Option::output.fileName() != "-") {
        // The output 'filename', as given by the -o option, might include one
        // or more directories, so we may need to rebase the output directory.
        QFileInfo fi(Option::output);

        QDir dir(QDir::cleanPath(fi.isDir() ? fi.absoluteFilePath() : fi.absolutePath()));

        // Don't treat Xcode project directory as part of OUT_PWD
        if (dir.dirName().endsWith(QLatin1String(".xcodeproj"))) {
            // Note: we're intentionally not using cdUp(), as the dir may not exist
            dir.setPath(QDir::cleanPath(dir.filePath("..")));
        }

        Option::output_dir = dir.path();
        QString absoluteFilePath = QDir::cleanPath(fi.absoluteFilePath());
        Option::output.setFileName(absoluteFilePath.mid(Option::output_dir.size() + 1));
    }

    QMakeProperty prop;
    switch (Option::qmake_mode) {
    case Option::QMAKE_QUERY_PROPERTY:
        return prop.queryProperty(Option::prop::properties);
    case Option::QMAKE_SET_PROPERTY:
        return prop.setProperty(Option::prop::properties);
    case Option::QMAKE_UNSET_PROPERTY:
        prop.unsetProperty(Option::prop::properties);
        return 0;
    default:
        break;
    }

    globals.setQMakeProperty(&prop);

    ProFileCache proFileCache;
    Option::proFileCache = &proFileCache;
    QMakeParser parser(&proFileCache, &vfs, &Option::evalHandler);
    Option::parser = &parser;

    QMakeProject project;
    int exit_val = 0;
    QStringList files;
    if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
        files << "(*hack*)"; //we don't even use files, but we do the for() body once
    else
        files = Option::mkfile::project_files;
    for(QStringList::Iterator pfile = files.begin(); pfile != files.end(); pfile++) {
        if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
           Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
            QString fn = Option::normalizePath(*pfile);
            if(!QFile::exists(fn)) {
                fprintf(stderr, "Cannot find file: %s.\n",
                        QDir::toNativeSeparators(fn).toLatin1().constData());
                exit_val = 2;
                continue;
            }

            //setup pwd properly
            debug_msg(1, "Resetting dir to: %s",
                      QDir::toNativeSeparators(oldpwd).toLatin1().constData());
            qmake_setpwd(oldpwd); //reset the old pwd
            int di = fn.lastIndexOf(QLatin1Char('/'));
            if(di != -1) {
                debug_msg(1, "Changing dir to: %s",
                          QDir::toNativeSeparators(fn.left(di)).toLatin1().constData());
                if(!qmake_setpwd(fn.left(di)))
                    fprintf(stderr, "Cannot find directory: %s\n",
                            QDir::toNativeSeparators(fn.left(di)).toLatin1().constData());
                fn = fn.right(fn.size() - di - 1);
            }

            Option::prepareProject(fn);

            // read project..
            if(!project.read(fn)) {
                fprintf(stderr, "Error processing project file: %s\n",
                        QDir::toNativeSeparators(*pfile).toLatin1().constData());
                exit_val = 3;
                continue;
            }
            if (Option::mkfile::do_preprocess) {
                project.dump();
                continue; //no need to create makefile
            }
        }

        bool success = true;
        MetaMakefileGenerator *mkfile = MetaMakefileGenerator::createMetaGenerator(&project, QString(), false, &success);
        if (!success)
            exit_val = 3;

        if (mkfile && !mkfile->write()) {
            if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
                fprintf(stderr, "Unable to generate project file.\n");
            else
                fprintf(stderr, "Unable to generate makefile for: %s\n",
                        QDir::toNativeSeparators(*pfile).toLatin1().constData());
            exit_val = 5;
        }
        delete mkfile;
        mkfile = nullptr;
    }
    qmakeClearCaches();
    return exit_val;
}